

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

czstring pstore::basic_logger::priority_string(priority p)

{
  char *pcStack_10;
  priority p_local;
  
  switch(p) {
  case emergency:
    pcStack_10 = "emergency";
    break;
  case alert:
    pcStack_10 = "alert";
    break;
  case critical:
    pcStack_10 = "critical";
    break;
  case error:
    pcStack_10 = "error";
    break;
  case warning:
    pcStack_10 = "warning";
    break;
  case notice:
    pcStack_10 = "notice";
    break;
  case info:
    pcStack_10 = "info";
    break;
  case debug:
    pcStack_10 = "debug";
    break;
  default:
    assert_failed("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/logging.cpp"
                  ,0x179);
  }
  return pcStack_10;
}

Assistant:

gsl::czstring basic_logger::priority_string (priority const p) noexcept {
            switch (p) {
            case priority::emergency: return "emergency";
            case priority::alert: return "alert";
            case priority::critical: return "critical";
            case priority::error: return "error";
            case priority::warning: return "warning";
            case priority::notice: return "notice";
            case priority::info: return "info";
            case priority::debug: return "debug";
            }
            PSTORE_ASSERT (0);
            return "emergency";
        }